

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O2

Result __thiscall
wabt::BinaryReaderLogging::OnImportGlobal
          (BinaryReaderLogging *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  Stream *this_00;
  Enum EVar1;
  char *pcVar2;
  string local_50;
  
  WriteIndent(this);
  this_00 = this->stream_;
  Type::GetName_abi_cxx11_(&local_50,&type);
  pcVar2 = "false";
  if (mutable_) {
    pcVar2 = "true";
  }
  Stream::Writef(this_00,
                 "OnImportGlobal(import_index: %u, global_index: %u, type: %s, mutable: %s)\n",
                 import_index,(ulong)global_index,local_50._M_dataplus._M_p,pcVar2);
  std::__cxx11::string::_M_dispose();
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x15])
                    (this->reader_,import_index,module_name._M_len,module_name._M_str,
                     field_name._M_len,field_name._M_str,(ulong)global_index,type,(ulong)mutable_);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImportGlobal(Index import_index,
                                           std::string_view module_name,
                                           std::string_view field_name,
                                           Index global_index,
                                           Type type,
                                           bool mutable_) {
  LOGF("OnImportGlobal(import_index: %" PRIindex ", global_index: %" PRIindex
       ", type: %s, mutable: "
       "%s)\n",
       import_index, global_index, type.GetName().c_str(),
       mutable_ ? "true" : "false");
  return reader_->OnImportGlobal(import_index, module_name, field_name,
                                 global_index, type, mutable_);
}